

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

string * __thiscall
Connection::to_string_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  _Rb_tree_const_iterator<char> _Var5;
  size_type sVar6;
  initializer_list<char> __l;
  allocator_type local_c9;
  string *local_c8;
  char c;
  undefined3 uStack_bf;
  undefined2 local_bc;
  undefined1 local_ba;
  set<char,_std::less<char>,_std::allocator<char>_> escapeChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string newLabel;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&escapeChars,
                 &this->name_from,"->");
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&escapeChars,
                 &this->name_to);
  std::__cxx11::string::~string((string *)&escapeChars);
  if ((this->label)._M_string_length != 0) {
    newLabel._M_dataplus._M_p = (pointer)&newLabel.field_2;
    newLabel._M_string_length = 0;
    newLabel.field_2._M_local_buf[0] = '\0';
    _c = 0x3b227d7b;
    local_bc = 0x2928;
    local_ba = 10;
    __l._M_len = 7;
    __l._M_array = &c;
    local_c8 = __return_storage_ptr__;
    std::set<char,_std::less<char>,_std::allocator<char>_>::set
              (&escapeChars,__l,(less<char> *)&local_70,&local_c9);
    pcVar3 = (this->label)._M_dataplus._M_p;
    sVar4 = (this->label)._M_string_length;
    p_Var1 = &escapeChars._M_t._M_impl.super__Rb_tree_header;
    for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
      cVar2 = pcVar3[sVar6];
      _c = CONCAT31(uStack_bf,cVar2);
      if (cVar2 != '\n') {
        if (cVar2 == '#') {
          _c = CONCAT31(uStack_bf,0x5f);
        }
        _Var5 = std::
                __find_if<std::_Rb_tree_const_iterator<char>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (escapeChars._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                           &c);
        if ((_Rb_tree_header *)_Var5._M_node != p_Var1) {
          std::__cxx11::string::push_back((char)&newLabel);
        }
        std::__cxx11::string::push_back((char)&newLabel);
      }
    }
    std::operator+(&local_70,"[label=\"",&newLabel);
    __return_storage_ptr__ = local_c8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,&local_70
                   ,"\"]");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&c);
    std::__cxx11::string::~string((string *)&local_70);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&escapeChars._M_t);
    std::__cxx11::string::~string((string *)&newLabel);
  }
  return __return_storage_ptr__;
}

Assistant:

string Connection::to_string() {
    string str = name_from + "->" + name_to;
    if (!label.empty()) {
        std::string newLabel;
        std::set<char> escapeChars = {'{', '}', '"', ';', '(', ')', '\n'};
        int i = 0;
        for (char c: label) {
            if (c == '\n')
                continue;
            if (c == '#')
                c = '_';
            i++;
            if (std::find(escapeChars.begin(), escapeChars.end(), c) != escapeChars.end()) {
                newLabel += '\\';
            }
            newLabel += c;
        }
        str += "[label=\"" + newLabel + "\"]";
    }
    return str;
}